

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::StandardNumericToDecimalCast<int,_int,_duckdb::SignedToDecimalOperator>
               (int input,int *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  bool bVar1;
  int iVar2;
  byte in_CL;
  int *in_RSI;
  int in_EDI;
  byte in_R8B;
  string error;
  int max_width;
  CastParameters *in_stack_ffffffffffffff78;
  string *error_message;
  string *in_stack_ffffffffffffff88;
  undefined1 auStack_61 [33];
  string asStack_40 [32];
  int iStack_20;
  byte bStack_1a;
  int *piStack_10;
  int iStack_8;
  byte bStack_1;
  
  bStack_1a = in_R8B;
  piStack_10 = in_RSI;
  iStack_8 = in_EDI;
  iStack_20 = UnsafeNumericCast<int,_long,_void>
                        (*(long *)(NumericHelper::POWERS_OF_TEN +
                                  (long)(int)((uint)in_CL - (uint)in_R8B) * 8));
  bVar1 = SignedToDecimalOperator::Operation<int,_int>(iStack_8,iStack_20);
  if (bVar1) {
    error_message = (string *)auStack_61;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(auStack_61 + 1),"Could not cast value %d to DECIMAL(%d,%d)",
               (allocator *)error_message);
    StringUtil::Format<int,_unsigned_char,_unsigned_char>
              (in_stack_ffffffffffffff88,(int)((ulong)error_message >> 0x20),
               (uchar)((ulong)error_message >> 0x18),(uchar)((ulong)error_message >> 0x10));
    ::std::__cxx11::string::~string((string *)(auStack_61 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)auStack_61);
    HandleCastError::AssignError(error_message,in_stack_ffffffffffffff78);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_40);
  }
  else {
    iVar2 = UnsafeNumericCast<int,_long,_void>
                      ((long)iStack_8 *
                       *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)bStack_1a * 8));
    *piStack_10 = iVar2;
    bStack_1 = 1;
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}